

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int fftsad(fitsfile *mfptr,HDUtracker *HDU,int *newPosition,char *newFileName)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  char local_848 [8];
  char filename2 [1025];
  char local_438 [8];
  char filename1 [1025];
  int status;
  int hdunum;
  int i;
  char *newFileName_local;
  int *newPosition_local;
  HDUtracker *HDU_local;
  fitsfile *mfptr_local;
  
  filename1[0x3fc] = '\0';
  filename1[0x3fd] = '\0';
  filename1[0x3fe] = '\0';
  filename1[0x3ff] = '\0';
  ffghdn(mfptr,(int *)(filename1 + 0x400));
  filename1._1020_4_ = ffflnm(mfptr,local_438,(int *)(filename1 + 0x3fc));
  filename1._1020_4_ = ffrtnm(local_438,local_848,(int *)(filename1 + 0x3fc));
  status = 0;
  while( true ) {
    bVar3 = false;
    if (status < HDU->nHDU) {
      bVar3 = false;
      if (HDU->position[status] == stack0xffffffffffffffd0) {
        iVar1 = strcmp(HDU->filename[status],local_848);
        bVar3 = iVar1 == 0;
      }
      bVar3 = (bool)(bVar3 ^ 1);
    }
    if (!bVar3) break;
    status = status + 1;
  }
  if (status == HDU->nHDU) {
    if (HDU->nHDU == 1000) {
      filename1[0x3fc] = 'Y';
      filename1[0x3fd] = '\x01';
      filename1[0x3fe] = '\0';
      filename1[0x3ff] = '\0';
    }
    else {
      pcVar2 = (char *)malloc(0x401);
      HDU->filename[status] = pcVar2;
      if (HDU->filename[status] == (char *)0x0) {
        filename1[0x3fc] = 'q';
        filename1[0x3fd] = '\0';
        filename1[0x3fe] = '\0';
        filename1[0x3ff] = '\0';
      }
      else {
        pcVar2 = (char *)malloc(0x401);
        HDU->newFilename[status] = pcVar2;
        if (HDU->newFilename[status] == (char *)0x0) {
          filename1[0x3fc] = 'q';
          filename1[0x3fd] = '\0';
          filename1[0x3fe] = '\0';
          filename1[0x3ff] = '\0';
          free(HDU->filename[status]);
        }
        else {
          HDU->position[status] = stack0xffffffffffffffd0;
          HDU->newPosition[status] = stack0xffffffffffffffd0;
          strcpy(HDU->filename[status],local_848);
          strcpy(HDU->newFilename[status],local_848);
          HDU->nHDU = HDU->nHDU + 1;
        }
      }
    }
  }
  else {
    filename1[0x3fc] = 'Z';
    filename1[0x3fd] = '\x01';
    filename1[0x3fe] = '\0';
    filename1[0x3ff] = '\0';
    if (newPosition != (int *)0x0) {
      *newPosition = HDU->newPosition[status];
    }
    if (newFileName != (char *)0x0) {
      strcpy(newFileName,HDU->newFilename[status]);
    }
  }
  iVar1._0_1_ = filename1[0x3fc];
  iVar1._1_1_ = filename1[0x3fd];
  iVar1._2_1_ = filename1[0x3fe];
  iVar1._3_1_ = filename1[0x3ff];
  return iVar1;
}

Assistant:

int fftsad(fitsfile   *mfptr,       /* pointer to an member HDU             */
	   HDUtracker *HDU,         /* pointer to an HDU tracker struct     */
	   int        *newPosition, /* new HDU position of the member HDU   */
	   char       *newFileName) /* file containing member HDU           */

/*
  add an HDU to the HDUtracker struct pointed to by HDU. The HDU is only 
  added if it does not already reside in the HDUtracker. If it already
  resides in the HDUtracker then the new HDU postion and file name are
  returned in  newPosition and newFileName (if != NULL)
*/

{
  int i;
  int hdunum;
  int status = 0;

  char filename1[FLEN_FILENAME];
  char filename2[FLEN_FILENAME];

  do
    {
      /* retrieve the HDU's position within the FITS file */

      fits_get_hdu_num(mfptr,&hdunum);
      
      /* retrieve the HDU's file name */
      
      status = fits_file_name(mfptr,filename1,&status);
      
      /* parse the file name and construct the "standard" URL for it */
      
      status = ffrtnm(filename1,filename2,&status);
      
      /* 
	 examine all the existing HDUs in the HDUtracker an see if this HDU
	 has already been registered
      */

      for(i = 0; 
       i < HDU->nHDU &&  !(HDU->position[i] == hdunum 
			   && strcmp(HDU->filename[i],filename2) == 0);
	  ++i);

      if(i != HDU->nHDU) 
	{
	  status = HDU_ALREADY_TRACKED;
	  if(newPosition != NULL) *newPosition = HDU->newPosition[i];
	  if(newFileName != NULL) strcpy(newFileName,HDU->newFilename[i]);
	  continue;
	}

      if(HDU->nHDU == MAX_HDU_TRACKER) 
	{
	  status = TOO_MANY_HDUS_TRACKED;
	  continue;
	}

      HDU->filename[i] = (char*) malloc(FLEN_FILENAME * sizeof(char));

      if(HDU->filename[i] == NULL)
	{
	  status = MEMORY_ALLOCATION;
	  continue;
	}

      HDU->newFilename[i] = (char*) malloc(FLEN_FILENAME * sizeof(char));

      if(HDU->newFilename[i] == NULL)
	{
	  status = MEMORY_ALLOCATION;
	  free(HDU->filename[i]);
	  continue;
	}

      HDU->position[i]    = hdunum;
      HDU->newPosition[i] = hdunum;

      strcpy(HDU->filename[i],filename2);
      strcpy(HDU->newFilename[i],filename2);
 
       ++(HDU->nHDU);

    }while(0);

  return(status);
}